

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O0

void select_free(CManager_conflict cm,void *task_datav)

{
  int iVar1;
  __pid_t _Var2;
  pthread_t pVar3;
  undefined8 *in_RSI;
  long in_RDI;
  CManager unaff_retaddr;
  timespec ts;
  SelectInitFunc select_free_function;
  void **task_data;
  FILE *in_stack_ffffffffffffffc0;
  timespec local_30;
  code *local_20;
  undefined8 *local_18;
  
  local_20 = (code *)*in_RSI;
  local_18 = in_RSI;
  if (*(long *)(in_RDI + 0x120) == 0) {
    iVar1 = CMtrace_init(unaff_retaddr,(CMTraceType)((ulong)in_RDI >> 0x20));
    if (iVar1 == 0) goto LAB_00129745;
  }
  else if (CMtrace_val[7] == 0) goto LAB_00129745;
  if (CMtrace_PID != 0) {
    in_stack_ffffffffffffffc0 = *(FILE **)(in_RDI + 0x120);
    _Var2 = getpid();
    pVar3 = pthread_self();
    fprintf(in_stack_ffffffffffffffc0,"P%lxT%lx - ",(long)_Var2,pVar3);
  }
  if (CMtrace_timing != 0) {
    clock_gettime(1,&local_30);
    fprintf(*(FILE **)(in_RDI + 0x120),"%lld.%.9ld - ",local_30.tv_sec,local_30.tv_nsec);
  }
  fprintf(*(FILE **)(in_RDI + 0x120),"calling select FREE function, %p\n",local_18[1]);
LAB_00129745:
  fflush(*(FILE **)(in_RDI + 0x120));
  (*local_20)(&CMstatic_trans_svcs,in_RDI,local_18 + 1);
  CMdlclose(in_stack_ffffffffffffffc0);
  free(local_18);
  return;
}

Assistant:

static void
 select_free(CManager cm, void *task_datav)
 {
     void **task_data = (void**)task_datav;
     SelectInitFunc select_free_function = (SelectInitFunc)task_data[0];
     CMtrace_out(cm, CMFreeVerbose, "calling select FREE function, %p\n", task_data[1]);
     select_free_function(&CMstatic_trans_svcs, cm, &task_data[1]);
#if !NO_DYNAMIC_LINKING
     CMdlclose(task_data[2]);
#endif
     free(task_data);
 }